

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::VariablesQbIncrementPosition(ChMatterMeshless *this,double dt_step)

{
  element_type *peVar1;
  element_type *peVar2;
  double dVar3;
  pointer psVar4;
  uint uVar5;
  ulong uVar6;
  pointer psVar7;
  double dVar8;
  undefined1 auVar9 [16];
  shared_ptr<chrono::fea::ChNodeMeshless> mnode;
  ChStrainTensor<double> strainplasticflow;
  double local_b0;
  __shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2> local_a8;
  double local_98;
  double dStack_90;
  ChVector<double> local_88 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_50;
  
  uVar5 = 0;
  dVar8 = dt_step;
  while( true ) {
    psVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar7 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)uVar5;
    if ((ulong)((long)psVar4 - (long)psVar7 >> 4) <= uVar6) {
      local_98 = dt_step;
      dStack_90 = dt_step;
      for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < (ulong)((long)psVar4 - (long)psVar7 >> 4);
          uVar5 = uVar5 + 1) {
        ChVariables::Get_qb((ChVectorRef *)&local_50,
                            &((psVar7[uVar6].
                               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->variables).super_ChVariables);
        ChVector<double>::
        ChVector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                  (local_88,(MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                             *)&local_50,(type *)0x0);
        psVar7 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        peVar2 = psVar7[uVar6].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        dVar8 = (peVar2->super_ChNodeXYZ).pos.m_data[2];
        dVar3 = (peVar2->super_ChNodeXYZ).pos.m_data[1];
        (peVar2->super_ChNodeXYZ).pos.m_data[0] =
             local_98 * local_88[0].m_data[0] + (peVar2->super_ChNodeXYZ).pos.m_data[0];
        (peVar2->super_ChNodeXYZ).pos.m_data[1] = dStack_90 * local_88[0].m_data[1] + dVar3;
        (peVar2->super_ChNodeXYZ).pos.m_data[2] = dt_step * local_88[0].m_data[2] + dVar8;
        psVar4 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      return;
    }
    std::__shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,
               &psVar7[uVar6].
                super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>);
    if (local_a8._M_ptr == (element_type *)0x0) break;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_88);
    peVar1 = (this->material).
             super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar2 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6].
             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_ChContinuumElastic).super_ChContinuumMaterial._vptr_ChContinuumMaterial[6])
              (peVar1,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_88,&peVar2->t_strain
               ,&peVar2->e_strain,&peVar2->p_strain);
    (*(((this->material).
        super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->super_ChContinuumElastic).super_ChContinuumMaterial._vptr_ChContinuumMaterial[8])();
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar8 * dt_step;
    auVar9 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar9);
    local_b0 = auVar9._0_8_;
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
              (&local_50,(MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_88,&local_b0);
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)
               &((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->p_strain,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                *)&local_50);
    peVar2 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6].
             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar8 = (peVar2->super_ChNodeXYZ).pos.m_data[1];
    (peVar2->pos_ref).m_data[0] = (peVar2->super_ChNodeXYZ).pos.m_data[0];
    (peVar2->pos_ref).m_data[1] = dVar8;
    dVar8 = (peVar2->super_ChNodeXYZ).pos.m_data[2];
    (peVar2->pos_ref).m_data[2] = dVar8;
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&peVar2->e_strain,
               (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&peVar2->t_strain);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               &((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->t_strain);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    uVar5 = uVar5 + 1;
  }
  __assert_fail("mnode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                ,0x25e,
                "virtual void chrono::fea::ChMatterMeshless::VariablesQbIncrementPosition(double)");
}

Assistant:

void ChMatterMeshless::VariablesQbIncrementPosition(double dt_step) {
    // if (!IsActive())
    //	return;

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeMeshless> mnode(nodes[j]);
        assert(mnode);

        // Integrate plastic flow
        ChStrainTensor<> strainplasticflow;
        material->ComputeReturnMapping(strainplasticflow,   // dEp, flow of elastic strain (correction)
                                       nodes[j]->t_strain,  // increment of total strain
                                       nodes[j]->e_strain,  // last elastic strain
                                       nodes[j]->p_strain   // last plastic strain
                                       );
        double dtpfact = dt_step * material->Get_flow_rate();
        if (dtpfact > 1.0)
            dtpfact = 1.0;  // clamp if dt is larger than plastic flow duration

        nodes[j]->p_strain += strainplasticflow * dtpfact;

        // Increment total elastic tensor and proceed for next step
        nodes[j]->pos_ref = nodes[j]->pos;
        nodes[j]->e_strain += nodes[j]->t_strain;
        //	nodes[j]->e_strain.MatrDec(strainplasticflow*dtpfact);
        nodes[j]->t_strain.setZero();  // unuseful? will be overwritten anyway
    }

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // Updates position with incremental action of speed contained in the
        // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

        ChVector<> newspeed(nodes[j]->variables.Get_qb());

        // ADVANCE POSITION: pos' = pos + dt * vel
        nodes[j]->SetPos(nodes[j]->GetPos() + newspeed * dt_step);
    }
}